

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::OutputFile::writePixels(OutputFile *this,int numScanLines)

{
  long lVar1;
  value_type pLVar2;
  bool bVar3;
  size_type sVar4;
  ArgExc *pAVar5;
  int *piVar6;
  Task *pTVar7;
  LineBuffer *this_00;
  Data *ofd;
  size_type sVar8;
  reference ppLVar9;
  IoExc *this_01;
  int iVar10;
  int in_ESI;
  void *__stat_loc;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  LineBuffer *lineBuffer;
  size_t i_2;
  string *exception;
  int numLines;
  LineBuffer *writeBuffer;
  int i_1;
  int numTasks_1;
  int last_1;
  int i;
  int numTasks;
  int last;
  TaskGroup taskGroup;
  int scanLineMax;
  int scanLineMin;
  int step;
  int stop;
  int nextCompressBuffer;
  int nextWriteBuffer;
  int first;
  Lock lock;
  Data *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  Data *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  Data *in_stack_fffffffffffffd70;
  TaskGroup *in_stack_fffffffffffffd78;
  LineBuffer *group;
  LineBufferTask *in_stack_fffffffffffffd80;
  size_type local_a0;
  string *local_98;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  TaskGroup local_50 [8];
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  int local_c;
  
  local_c = in_ESI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffd50,
             (Mutex *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
             (bool)in_stack_fffffffffffffd47);
  sVar4 = std::
          vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
          ::size((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                  *)(*(long *)(in_RDI + 8) + 0xe8));
  if (sVar4 == 0) {
    pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar5,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  lVar1 = *(long *)(in_RDI + 8);
  local_34 = (*(int *)(lVar1 + 0x78) - *(int *)(lVar1 + 0x8c)) / *(int *)(lVar1 + 0x120);
  local_30 = local_34;
  IlmThread_2_5::TaskGroup::TaskGroup(local_50);
  if (*(int *)(*(long *)(in_RDI + 8) + 0x80) == 0) {
    lVar1 = *(long *)(in_RDI + 8);
    local_54 = (int)(~*(uint *)(lVar1 + 0x8c) + local_c + *(int *)(lVar1 + 0x78)) /
               *(int *)(lVar1 + 0x120);
    local_44 = *(int *)(*(long *)(in_RDI + 8) + 0x78);
    local_48 = *(int *)(*(long *)(in_RDI + 8) + 0x78) + -1 + local_c;
    sVar4 = std::
            vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x108));
    local_5c = (int)sVar4;
    local_60 = (local_54 - local_30) + 1;
    piVar6 = std::min<int>(&local_5c,&local_60);
    local_64 = 1;
    piVar6 = std::max<int>(piVar6,&local_64);
    local_58 = *piVar6;
    for (local_68 = 0; local_68 < local_58; local_68 = local_68 + 1) {
      pTVar7 = (Task *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int)in_stack_fffffffffffffd68,
                 (int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      IlmThread_2_5::ThreadPool::addGlobalTask(pTVar7);
    }
    local_38 = local_30 + local_58;
    local_3c = local_54 + 1;
    local_40 = 1;
  }
  else {
    lVar1 = *(long *)(in_RDI + 8);
    local_6c = (((*(int *)(lVar1 + 0x78) - local_c) - *(int *)(lVar1 + 0x8c)) + 1) /
               *(int *)(lVar1 + 0x120);
    local_48 = *(int *)(*(long *)(in_RDI + 8) + 0x78);
    local_44 = (*(int *)(*(long *)(in_RDI + 8) + 0x78) - local_c) + 1;
    sVar4 = std::
            vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                    *)(*(long *)(in_RDI + 8) + 0x108));
    local_74 = (int)sVar4;
    local_78 = (local_30 - local_6c) + 1;
    piVar6 = std::min<int>(&local_74,&local_78);
    local_7c = 1;
    piVar6 = std::max<int>(piVar6,&local_7c);
    local_70 = *piVar6;
    for (local_80 = 0; local_80 < local_70; local_80 = local_80 + 1) {
      pTVar7 = (Task *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int)in_stack_fffffffffffffd68,
                 (int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      IlmThread_2_5::ThreadPool::addGlobalTask(pTVar7);
    }
    local_38 = local_30 - local_70;
    local_3c = local_6c - 1;
    local_40 = -1;
  }
  while( true ) {
    if (*(int *)(*(long *)(in_RDI + 8) + 0x7c) < 1) {
      pAVar5 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar5,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar5,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    __stat_loc = (void *)(ulong)local_34;
    this_00 = Data::getLineBuffer(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
    group = this_00;
    anon_unknown_6::LineBuffer::wait(this_00,__stat_loc);
    iVar10 = (this_00->scanLineMax - this_00->scanLineMin) + 1;
    *(int *)(*(long *)(in_RDI + 8) + 0x7c) = *(int *)(*(long *)(in_RDI + 8) + 0x7c) - iVar10;
    if ((this_00->partiallyFull & 1U) != 0) break;
    anon_unknown_6::writePixelData
              ((OutputStreamMutex *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               in_stack_fffffffffffffd38,(LineBuffer *)0x86f26a);
    local_34 = local_34 + local_40;
    *(int *)(*(long *)(in_RDI + 8) + 0x78) =
         *(int *)(*(long *)(in_RDI + 8) + 0x78) + local_40 * iVar10;
    anon_unknown_6::LineBuffer::post((LineBuffer *)0x86f2b5);
    if (local_34 == local_3c) {
      bVar3 = false;
      goto LAB_0086f382;
    }
    if (local_38 != local_3c) {
      ofd = (Data *)operator_new(0x20);
      anon_unknown_6::LineBufferTask::LineBufferTask
                (in_stack_fffffffffffffd80,(TaskGroup *)group,ofd,
                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),(int)in_stack_fffffffffffffd68,
                 (int)((ulong)in_stack_fffffffffffffd60 >> 0x20));
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)ofd);
      local_38 = local_40 + local_38;
    }
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x78) =
       *(int *)(*(long *)(in_RDI + 8) + 0x78) + local_40 * iVar10;
  anon_unknown_6::LineBuffer::post((LineBuffer *)0x86f238);
  bVar3 = true;
LAB_0086f382:
  IlmThread_2_5::TaskGroup::~TaskGroup(local_50);
  if (!bVar3) {
    local_98 = (string *)0x0;
    local_a0 = 0;
    while (sVar4 = local_a0,
          sVar8 = std::
                  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ::size((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                          *)(*(long *)(in_RDI + 8) + 0x108)), sVar4 < sVar8) {
      ppLVar9 = std::
                vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                              *)(*(long *)(in_RDI + 8) + 0x108),local_a0);
      pLVar2 = *ppLVar9;
      if (((pLVar2->hasException & 1U) != 0) && (local_98 == (string *)0x0)) {
        local_98 = (string *)&pLVar2->exception;
      }
      pLVar2->hasException = false;
      local_a0 = local_a0 + 1;
    }
    if (local_98 != (string *)0x0) {
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,local_98);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
  }
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  return;
}

Assistant:

void	
OutputFile::writePixels (int numScanLines)
{
    try
    {
        Lock lock (*_data->_streamData);

	if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first = (_data->currentScanLine - _data->minY) /
                         _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
	    // all tasks are complete.
            //
            
            TaskGroup taskGroup;
            
            //
            // Determine the range of lineBuffers that intersect the scan
	    // line range.  Then add the initial compression tasks to the
	    // thread pool.  We always add in at least one task but the
	    // individual task might not do anything if numScanLines == 0.
            //
    
            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;
    
                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;
    
                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         last - first + 1),
				    1);

                for (int i = 0; i < numTasks; i++)
		{
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first + i,
                                             scanLineMin, scanLineMax));
		}
    
                nextCompressBuffer = first + numTasks;
                stop = last + 1;
                step = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;
    
                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;
    
                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         first - last + 1),
				    1);

                for (int i = 0; i < numTasks; i++)
		{
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first - i,
                                             scanLineMin, scanLineMax));
		}
    
                nextCompressBuffer = first - numTasks;
                stop = last - 1;
                step = -1;
            }
            
            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc ("Tried to write more scan lines "
                                       "than specified by the data window.");
                }
    
		//
                // Wait until the next line buffer is ready to be written
		//

                LineBuffer *writeBuffer =
		    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait();
                
                int numLines = writeBuffer->scanLineMax - 
                               writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;
    
		//
                // If the line buffer is only partially full, then it is
		// not complete and we cannot write it to disk yet.
		//

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine = _data->currentScanLine +
                                             step * numLines;
                    writeBuffer->post();
    
                    return;
                }
    
		//
                // Write the line buffer
		//

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine = _data->currentScanLine +
                                         step * numLines;
    
                #ifdef DEBUG
    
                    assert (_data->currentScanLine ==
                            ((_data->lineOrder == INCREASING_Y) ?
                             writeBuffer->scanLineMax + 1:
                             writeBuffer->scanLineMin - 1));
    
                #endif
                
		//
                // Release the lock on the line buffer
		//

                writeBuffer->post();
                
		//
                // If this was the last line buffer in the scanline range
		//

                if (nextWriteBuffer == stop)
                    break;
    
		//
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
		//

                if (nextCompressBuffer == stop)
                    continue;
    
		//
                // Add nextCompressBuffer as a compression task
		//

                ThreadPool::addGlobalTask
                    (new LineBufferTask (&taskGroup, _data, nextCompressBuffer,
                                         scanLineMin, scanLineMax));
                
		//
                // Update the next line buffer we need to compress
		//

                nextCompressBuffer += step;
            }
        
	    //
            // Finish all tasks
	    //
        }
        
	//
	// Exeption handling:
	//
	// LineBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to OutputFile::writePixels().
	// LineBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the line buffers.
	// Now we check if any line buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple line buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
	{
            LineBuffer *lineBuffer = _data->lineBuffers[i];

	    if (lineBuffer->hasException && !exception)
		exception = &lineBuffer->exception;

	    lineBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Failed to write pixel data to image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}